

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  Var target;
  RecyclableObject *function;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_short>
                     (this,(playout->
                           super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                           ).
                           super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                           .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Function
                     );
  function = OP_CallGetFunc(this,target);
  OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,
             (playout->
             super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
             callFlags,playout->profileId,
             (playout->
             super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
             super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
             inlineCacheIndex,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_ProfiledCallIWithICIndex(const unaligned OpLayoutDynamicProfile<T>* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, playout->profileId, playout->inlineCacheIndex); }